

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O3

void shuffle(vector<int,_std::allocator<int>_> *v)

{
  int iVar1;
  pointer piVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  pointer piVar7;
  
  srand(9);
  piVar7 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar5 = (uint)((ulong)((long)(v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar7) >> 2);
  if (1 < (int)uVar5) {
    uVar6 = (ulong)(uVar5 & 0x7fffffff);
    do {
      uVar5 = rand();
      uVar4 = (ulong)uVar5 % (uVar6 & 0xffffffff);
      piVar2 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      iVar1 = piVar7[uVar6 - 1];
      piVar7[uVar6 - 1] = piVar2[uVar4];
      piVar2[uVar4] = iVar1;
      bVar3 = 2 < uVar6;
      uVar6 = uVar6 - 1;
      piVar7 = piVar2;
    } while (bVar3);
  }
  return;
}

Assistant:

static void shuffle(vector<int>* v) {
  srand(9);
  for (int n = v->size(); n >= 2; n--) {
    swap((*v)[n - 1], (*v)[static_cast<unsigned>(rand()) % n]);
  }
}